

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O3

void __thiscall
despot::SimpleRockSample::PrintAction(SimpleRockSample *this,ACT_TYPE action,ostream *out)

{
  long lVar1;
  char *pcVar2;
  
  switch(action) {
  case 0:
    pcVar2 = "Sample";
    lVar1 = 6;
    goto LAB_00106120;
  case 1:
    pcVar2 = "EAST ";
    break;
  case 2:
    pcVar2 = "West";
    lVar1 = 4;
    goto LAB_00106120;
  case 3:
    pcVar2 = "Check";
    break;
  default:
    return;
  }
  lVar1 = 5;
LAB_00106120:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void SimpleRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == A_SAMPLE)
		out << "Sample" << endl;
	if (action == A_CHECK)
		out << "Check" << endl;
	if (action == A_EAST)
		out << "EAST " << endl;
	if (action == A_WEST)
		out << "West" << endl;
}